

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Functional.cpp
# Opt level: O3

void __thiscall Functional::make_k(Functional *this,int k)

{
  std::vector<Group,_std::allocator<Group>_>::operator=
            ((vector<Group,_std::allocator<Group>_> *)&this->kmean_search,
             (vector<Group,_std::allocator<Group>_> *)this);
  std::vector<Point,_std::allocator<Point>_>::operator=
            (&(this->kmean_search).f.all_points,&(this->f).all_points);
  (this->kmean_search).points_nmb =
       (int)((ulong)((long)(this->f).all_points.super__Vector_base<Point,_std::allocator<Point>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->f).all_points.super__Vector_base<Point,_std::allocator<Point>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  (this->kmean_search).k = k;
  Kmean::k_mean(&this->kmean_search);
  std::
  vector<std::vector<Cluster,_std::allocator<Cluster>_>,_std::allocator<std::vector<Cluster,_std::allocator<Cluster>_>_>_>
  ::push_back(&this->searches,&(this->kmean_search).clusters);
  return;
}

Assistant:

void Functional::make_k(int k) {

    kmean_search.f = f;
    kmean_search.points_nmb = (int) f.all_points.size();
    kmean_search.k = k;
    kmean_search.k_mean();
    searches.push_back(kmean_search.clusters);

}